

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONDebug.cpp
# Opt level: O0

json_error_callback_t JSONDebug::register_callback(json_error_callback_t callback)

{
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *p_Var1;
  json_error_callback_t res;
  json_error_callback_t callback_local;
  
  p_Var1 = JSONSingleton<void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::get();
  JSONSingleton<void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::set((_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)callback
       );
  return (json_error_callback_t)p_Var1;
}

Assistant:

json_error_callback_t JSONDebug::register_callback(json_error_callback_t callback) json_nothrow {
		json_error_callback_t res = JSONSingleton<json_error_callback_t>::get();
        JSONSingleton<json_error_callback_t>::set(callback);
		return res;
    }